

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O3

Reals __thiscall
Omega_h::get_variation_metrics(Omega_h *this,Mesh *mesh,Real knob,Int dim,Int ncomps,Reals *data)

{
  int *piVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  Alloc *pAVar5;
  LO LVar6;
  long *plVar7;
  undefined7 uVar10;
  undefined7 extraout_var;
  void *pvVar8;
  void *extraout_RAX;
  undefined7 extraout_var_00;
  Alloc *pAVar9;
  Alloc *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined7 extraout_var_01;
  Alloc *extraout_RAX_02;
  undefined8 uVar11;
  void *extraout_RDX;
  void *pvVar12;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  char *pcVar13;
  char *pcVar14;
  int comp;
  size_t sVar15;
  bool bVar16;
  Reals RVar17;
  Reals vert_data;
  Reals vert_grads;
  Alloc *local_110;
  void *local_108;
  Alloc *local_100;
  void *local_f8;
  Real local_f0;
  Alloc **local_e8;
  Alloc **local_e0;
  Reals local_d8;
  Reals local_c8;
  Read<double> local_b8;
  Reals local_a8;
  Reals local_98;
  Reals local_88;
  long *local_78;
  undefined8 uStack_70;
  Reals local_60;
  Reals local_50;
  Reals local_40;
  undefined1 auVar4 [15];
  
  pAVar9 = (data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar9 & 1) == 0) {
    sVar15 = pAVar9->size;
  }
  else {
    sVar15 = (ulong)pAVar9 >> 3;
  }
  local_f0 = knob;
  LVar6 = Mesh::nents(mesh,dim);
  pAVar9 = (Alloc *)(ulong)(uint)(LVar6 * ncomps);
  if (LVar6 * ncomps != (uint)(sVar15 >> 3)) {
    pcVar14 = "data.size() == mesh->nents(dim) * ncomps";
    pcVar13 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
    ;
    uVar11 = 0x2b;
    goto LAB_00367e48;
  }
  if (ncomps == 1) {
    if (dim == 0) {
      local_40.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.write_.shared_alloc_.alloc)->use_count =
               (local_40.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_40.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
      recover_hessians((Omega_h *)&local_110,mesh,&local_40);
      pAVar9 = local_40.write_.shared_alloc_.alloc;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
        }
      }
      uVar2 = mesh->dim_;
      if (3 < uVar2) {
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      local_88.write_.shared_alloc_.alloc = local_110;
      if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_88.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
        }
        else {
          local_110->use_count = local_110->use_count + 1;
        }
      }
      local_88.write_.shared_alloc_.direct_ptr = local_108;
      RVar17 = get_hessian_metrics(this,uVar2,&local_88,local_f0);
      auVar4 = RVar17.write_.shared_alloc_._1_15_;
      pAVar9 = local_88.write_.shared_alloc_.alloc;
    }
    else {
      if (3 < (uint)mesh->dim_) {
        pcVar14 = "0 <= dim_ && dim_ <= 3";
        pcVar13 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
        ;
        uVar11 = 0x33;
LAB_00367e48:
        fail("assertion %s failed at %s +%d\n",pcVar14,pcVar13,uVar11);
      }
      if (mesh->dim_ != dim) {
        pcVar14 = "false";
        pcVar13 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
        ;
        uVar11 = 0x42;
        goto LAB_00367e48;
      }
      local_50.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_50.write_.shared_alloc_.alloc =
               (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_50.write_.shared_alloc_.alloc)->use_count =
               (local_50.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_50.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
      project_by_fit((Omega_h *)&local_110,mesh,&local_50);
      pAVar9 = local_50.write_.shared_alloc_.alloc;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
        }
      }
      local_60.write_.shared_alloc_.alloc = local_110;
      if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
        }
        else {
          local_110->use_count = local_110->use_count + 1;
        }
      }
      local_60.write_.shared_alloc_.direct_ptr = local_108;
      recover_gradients((Omega_h *)&local_100,mesh,&local_60);
      pAVar9 = local_60.write_.shared_alloc_.alloc;
      if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
        }
      }
      uVar2 = mesh->dim_;
      if (3 < uVar2) {
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      local_98.write_.shared_alloc_.alloc = local_100;
      if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_98.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
        }
        else {
          local_100->use_count = local_100->use_count + 1;
        }
      }
      local_98.write_.shared_alloc_.direct_ptr = local_f8;
      RVar17 = get_gradient_metrics(this,uVar2,&local_98,local_f0);
      pAVar9 = local_98.write_.shared_alloc_.alloc;
      pvVar12 = RVar17.write_.shared_alloc_.direct_ptr;
      uVar11 = CONCAT71(RVar17.write_.shared_alloc_.alloc._1_7_,
                        local_98.write_.shared_alloc_.alloc == (Alloc *)0x0);
      if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
          local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
          uVar11 = extraout_RAX_01;
          pvVar12 = extraout_RDX_07;
        }
      }
      auVar3._8_8_ = pvVar12;
      auVar3._0_8_ = uVar11;
      auVar4 = auVar3._1_15_;
      pAVar9 = local_100;
    }
    pvVar12 = auVar4._7_8_;
    uVar10 = auVar4._0_7_;
    if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
      piVar1 = &pAVar9->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar9);
        operator_delete(pAVar9,0x48);
        pvVar12 = extraout_RDX_08;
        uVar10 = extraout_var_01;
      }
    }
    pAVar9 = (Alloc *)CONCAT71(uVar10,local_110 == (Alloc *)0x0);
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      piVar1 = &local_110->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_110);
        operator_delete(local_110,0x48);
        pAVar9 = extraout_RAX_02;
        pvVar12 = extraout_RDX_09;
      }
    }
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    pvVar12 = extraout_RDX;
    if (0 < ncomps) {
      comp = 0;
      local_e0 = &local_110;
      local_e8 = &local_100;
      do {
        local_b8.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
        if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b8.write_.shared_alloc_.alloc =
                 (Alloc *)((local_b8.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_b8.write_.shared_alloc_.alloc)->use_count =
                 (local_b8.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_b8.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
        get_component<double>((Omega_h *)&local_110,&local_b8,ncomps,comp);
        pAVar9 = local_b8.write_.shared_alloc_.alloc;
        if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
            operator_delete(pAVar9,0x48);
          }
        }
        local_a8.write_.shared_alloc_.alloc = local_110;
        if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a8.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
          }
          else {
            local_110->use_count = local_110->use_count + 1;
          }
        }
        pAVar9 = local_a8.write_.shared_alloc_.alloc;
        local_a8.write_.shared_alloc_.direct_ptr = local_108;
        RVar17 = get_variation_metrics((Omega_h *)&local_100,mesh,local_f0,dim,1,&local_a8);
        pvVar12 = RVar17.write_.shared_alloc_.direct_ptr;
        if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
          piVar1 = &pAVar9->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar9);
            operator_delete(pAVar9,0x48);
            pvVar12 = extraout_RDX_00;
          }
        }
        if (comp == 0) {
          pAVar9 = *(Alloc **)this;
          if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
            piVar1 = &pAVar9->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar9);
              operator_delete(pAVar9,0x48);
              pvVar12 = extraout_RDX_01;
            }
          }
          *(Alloc **)this = local_100;
          if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              *(size_t *)this = local_100->size * 8 + 1;
            }
            else {
              local_100->use_count = local_100->use_count + 1;
            }
          }
          *(void **)(this + 8) = local_f8;
          pvVar8 = local_f8;
        }
        else {
          LVar6 = Mesh::nverts(mesh);
          local_c8.write_.shared_alloc_.alloc = *(Alloc **)this;
          if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_c8.write_.shared_alloc_.alloc =
                   (Alloc *)((local_c8.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_c8.write_.shared_alloc_.alloc)->use_count =
                   (local_c8.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_c8.write_.shared_alloc_.direct_ptr = *(void **)(this + 8);
          local_d8.write_.shared_alloc_.alloc = local_100;
          if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_d8.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
            }
            else {
              local_100->use_count = local_100->use_count + 1;
            }
          }
          local_d8.write_.shared_alloc_.direct_ptr = local_f8;
          RVar17 = intersect_metrics((Omega_h *)&local_78,LVar6,&local_c8,&local_d8);
          pvVar12 = RVar17.write_.shared_alloc_.direct_ptr;
          pAVar9 = *(Alloc **)this;
          if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
            piVar1 = &pAVar9->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar9);
              operator_delete(pAVar9,0x48);
              pvVar12 = extraout_RDX_02;
            }
          }
          pAVar9 = local_d8.write_.shared_alloc_.alloc;
          *(long **)this = local_78;
          *(undefined8 *)(this + 8) = uStack_70;
          bVar16 = ((ulong)local_78 & 7) != 0;
          pvVar12 = (void *)CONCAT71((int7)((ulong)pvVar12 >> 8),bVar16 || local_78 == (long *)0x0);
          plVar7 = local_78;
          if ((!bVar16 && local_78 != (long *)0x0) && (entering_parallel == '\x01')) {
            *(int *)(local_78 + 6) = (int)local_78[6] + -1;
            plVar7 = (long *)(*local_78 * 8 + 1);
            *(long **)this = plVar7;
          }
          local_78 = (long *)0x0;
          uStack_70 = 0;
          uVar10 = (undefined7)((ulong)plVar7 >> 8);
          if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
              operator_delete(pAVar9,0x48);
              pvVar12 = extraout_RDX_03;
              uVar10 = extraout_var;
            }
          }
          pAVar9 = local_c8.write_.shared_alloc_.alloc;
          pvVar8 = (void *)CONCAT71(uVar10,local_c8.write_.shared_alloc_.alloc == (Alloc *)0x0);
          if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
              operator_delete(pAVar9,0x48);
              pvVar8 = extraout_RAX;
              pvVar12 = extraout_RDX_04;
            }
          }
        }
        pAVar9 = local_100;
        uVar10 = (undefined7)((ulong)pvVar8 >> 8);
        if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
          piVar1 = &local_100->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_100);
            operator_delete(pAVar9,0x48);
            pvVar12 = extraout_RDX_05;
            uVar10 = extraout_var_00;
          }
        }
        pAVar5 = local_110;
        pAVar9 = (Alloc *)CONCAT71(uVar10,local_110 == (Alloc *)0x0);
        if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
          piVar1 = &local_110->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_110);
            operator_delete(pAVar5,0x48);
            pAVar9 = extraout_RAX_00;
            pvVar12 = extraout_RDX_06;
          }
        }
        comp = comp + 1;
      } while (ncomps != comp);
    }
  }
  RVar17.write_.shared_alloc_.direct_ptr = pvVar12;
  RVar17.write_.shared_alloc_.alloc = pAVar9;
  return (Reals)RVar17.write_.shared_alloc_;
}

Assistant:

static Reals get_variation_metrics(
    Mesh* mesh, Real knob, Int dim, Int ncomps, Reals data) {
  OMEGA_H_CHECK(data.size() == mesh->nents(dim) * ncomps);
  if (ncomps == 1) {
    if (dim == VERT) {
      auto hessians = recover_hessians(mesh, data);
      return get_hessian_metrics(mesh->dim(), hessians, knob);
    } else if (dim == mesh->dim()) {
      auto vert_data = project_by_fit(mesh, data);
      auto vert_grads = recover_gradients(mesh, vert_data);
      return get_gradient_metrics(mesh->dim(), vert_grads, knob);
    }
  } else {
    Reals metrics;
    for (Int comp = 0; comp < ncomps; ++comp) {
      auto comp_data = get_component(data, ncomps, comp);
      auto comp_metrics = get_variation_metrics(mesh, knob, dim, 1, comp_data);
      if (comp) {
        metrics = intersect_metrics(mesh->nverts(), metrics, comp_metrics);
      } else {
        metrics = comp_metrics;
      }
    }
    return metrics;
  }
  OMEGA_H_NORETURN(Reals());
}